

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::substituteFreeCol
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt row,HighsInt col,
          bool relaxRowDualBounds)

{
  int in_ECX;
  HPresolve *in_RDI;
  double rhs;
  RowType rowType;
  HighsInt in_stack_00000098;
  HighsInt in_stack_0000009c;
  HighsPostsolveStack *in_stack_000000a0;
  double in_stack_000000b0;
  HighsInt in_stack_000000b8;
  HighsInt in_stack_000000bc;
  HPresolve *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffff74;
  RowType *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  HighsInt in_stack_ffffffffffffff8c;
  HighsInt in_stack_ffffffffffffff9c;
  HPresolve *in_stack_ffffffffffffffa0;
  
  dualImpliedFreeGetRhsAndRowType
            (in_RDI,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             SUB41((uint)in_stack_ffffffffffffff74 >> 0x18,0));
  std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->model->col_cost_,(long)in_ECX);
  getStoredRow(in_RDI);
  getColumnVector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  HighsPostsolveStack::freeColSubstitution<HighsTripletPositionSlice,HighsTripletListSlice>
            (in_stack_000000a0,in_stack_0000009c,in_stack_00000098,(double)this,
             (double)postsolve_stack,row,
             (HighsMatrixSlice<HighsTripletPositionSlice> *)CONCAT17(relaxRowDualBounds,_rowType),
             (HighsMatrixSlice<HighsTripletListSlice> *)rhs);
  substitute(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,in_stack_000000b0);
  return;
}

Assistant:

void HPresolve::substituteFreeCol(HighsPostsolveStack& postsolve_stack,
                                  HighsInt row, HighsInt col,
                                  bool relaxRowDualBounds) {
  assert(!rowDeleted[row]);
  assert(!colDeleted[col]);
  assert(isDualImpliedFree(row));
  assert(isImpliedFree(col));

  HighsPostsolveStack::RowType rowType;
  double rhs;
  dualImpliedFreeGetRhsAndRowType(row, rhs, rowType, relaxRowDualBounds);

  postsolve_stack.freeColSubstitution(row, col, rhs, model->col_cost_[col],
                                      rowType, getStoredRow(),
                                      getColumnVector(col));

  // todo, check integrality of coefficients and allow this
  substitute(row, col, rhs);
}